

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O1

int CVodeSetEtaMax(void *cvode_mem,sunrealtype eta_max_gs)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x1f8,"CVodeSetEtaMax",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_io.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    if (eta_max_gs <= 1.0) {
      *(undefined8 *)((long)cvode_mem + 800) = 0x4024000000000000;
    }
    else {
      *(sunrealtype *)((long)cvode_mem + 800) = eta_max_gs;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetEtaMax(void* cvode_mem, sunrealtype eta_max_gs)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  /* set allowed value or use default */
  if (eta_max_gs <= ONE) { cv_mem->cv_eta_max_gs = ETA_MAX_GS_DEFAULT; }
  else { cv_mem->cv_eta_max_gs = eta_max_gs; }

  return (CV_SUCCESS);
}